

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  uint uVar1;
  size_t sVar2;
  ZSTD_CCtx_params *in_RCX;
  long in_R8;
  int unaff_retaddr;
  ZSTD_hufCTablesMetadata_t *in_stack_00000008;
  ZSTD_hufCTables_t *in_stack_00000010;
  ZSTD_hufCTables_t *in_stack_00000018;
  void *in_stack_00000020;
  ZSTD_fseCTablesMetadata_t *in_stack_00000028;
  ZSTD_CCtx_params *in_stack_00000030;
  ZSTD_fseCTables_t *in_stack_00000038;
  size_t err_code_1;
  size_t err_code;
  int hufFlags;
  int huf_useOptDepth;
  size_t litSize;
  size_t local_8;
  
  ZSTD_literalsCompressionIsDisabled(in_RCX);
  sVar2 = ZSTD_buildBlockEntropyStats_literals
                    (in_stack_00000028,(size_t)in_stack_00000020,in_stack_00000018,in_stack_00000010
                     ,in_stack_00000008,unaff_retaddr,(void *)err_code_1,err_code,hufFlags);
  *(size_t *)(in_R8 + 0x88) = sVar2;
  local_8 = *(size_t *)(in_R8 + 0x88);
  uVar1 = ERR_isError(local_8);
  if (uVar1 == 0) {
    sVar2 = ZSTD_buildBlockEntropyStats_sequences
                      ((seqStore_t *)err_code,(ZSTD_fseCTables_t *)err_code_1,in_stack_00000038,
                       in_stack_00000030,in_stack_00000028,in_stack_00000020,(size_t)cctxParams);
    *(size_t *)(in_R8 + 0x128) = sVar2;
    local_8 = *(size_t *)(in_R8 + 0x128);
    uVar1 = ERR_isError(local_8);
    if (uVar1 == 0) {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}